

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

t_results_queue * t_results_queue_init(void)

{
  t_results_queue *ptVar1;
  
  ptVar1 = (t_results_queue *)malloc(0x78);
  pthread_mutex_init((pthread_mutex_t *)&ptVar1->result_m,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&ptVar1->result_avail_c,(pthread_condattr_t *)0x0);
  ptVar1->result_head = (t_pool_result *)0x0;
  ptVar1->result_tail = (t_pool_result *)0x0;
  ptVar1->next_serial = 0;
  ptVar1->curr_serial = 0;
  ptVar1->queue_len = 0;
  ptVar1->pending = 0;
  return ptVar1;
}

Assistant:

t_results_queue *t_results_queue_init(void) {
    t_results_queue *q = malloc(sizeof(*q));

    pthread_mutex_init(&q->result_m, NULL);
    pthread_cond_init(&q->result_avail_c, NULL);

    q->result_head = NULL;
    q->result_tail = NULL;
    q->next_serial = 0;
    q->curr_serial = 0;
    q->queue_len   = 0;
    q->pending     = 0;

    return q;
}